

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.hh
# Opt level: O2

bool __thiscall dtc::input_buffer::consume_binary<unsigned_int>(input_buffer *this,uint *out)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  
  iVar1 = this->cursor;
  iVar5 = 4;
  iVar3 = 4 - iVar1 % 4;
  if (iVar1 % 4 == 0) {
    iVar3 = 0;
  }
  if (this->size < iVar3 + iVar1 + 4) {
    bVar6 = false;
  }
  else {
    this->cursor = iVar3 + iVar1;
    if ((iVar3 + iVar1 & 3U) != 0) {
      __assert_fail("cursor % type_size == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/input_buffer.hh"
                    ,0xf4,"bool dtc::input_buffer::consume_binary(T &) [T = unsigned int]");
    }
    *out = 0;
    pcVar2 = this->buffer;
    uVar4 = 0;
    while( true ) {
      bVar6 = iVar5 == 0;
      iVar5 = iVar5 + -1;
      if ((bVar6) || (this->size < this->cursor)) break;
      *out = uVar4 << 8;
      iVar1 = this->cursor;
      this->cursor = iVar1 + 1;
      uVar4 = (uint)(byte)pcVar2[iVar1] | *out;
      *out = uVar4;
    }
  }
  return bVar6;
}

Assistant:

bool consume_binary(T &out)
	{
		int align = 0;
		int type_size = sizeof(T);
		if (cursor % type_size != 0)
		{
			align = type_size - (cursor % type_size);
		}
		if (size < cursor + align + type_size)
		{
			return false;
		}
		cursor += align;
		assert(cursor % type_size == 0);
		out = 0;
		for (int i=0 ; i<type_size ; ++i)
		{
			if (size < cursor)
			{
				return false;
			}
			out <<= 8;
			out |= (((T)buffer[cursor++]) & 0xff);
		}
		return true;
	}